

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall
llvm::raw_ostream::SetBufferAndMode(raw_ostream *this,char *BufferStart,size_t Size,BufferKind Mode)

{
  bool bVar1;
  uint __line;
  char *__assertion;
  
  bVar1 = Size != 0 && BufferStart != (char *)0x0;
  if (Mode == Unbuffered) {
    bVar1 = BufferStart == (char *)0x0 && Size == 0;
  }
  if (bVar1) {
    if (this->OutBufCur == this->OutBufStart) {
      if ((this->OutBufCur != (char *)0x0) && (this->BufferMode == InternalBuffer)) {
        operator_delete__(this->OutBufStart);
      }
      this->OutBufStart = BufferStart;
      this->OutBufEnd = BufferStart + Size;
      this->OutBufCur = BufferStart;
      this->BufferMode = Mode;
      if (-1 < (long)Size) {
        return;
      }
      __assertion = "OutBufStart <= OutBufEnd && \"Invalid size!\"";
      __line = 0x7a;
    }
    else {
      __assertion = "GetNumBytesInBuffer() == 0 && \"Current buffer is non-empty!\"";
      __line = 0x71;
    }
  }
  else {
    __assertion = 
    "((Mode == BufferKind::Unbuffered && !BufferStart && Size == 0) || (Mode != BufferKind::Unbuffered && BufferStart && Size != 0)) && \"stream must be unbuffered or have at least one byte\""
    ;
    __line = 0x6e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,__line,"void llvm::raw_ostream::SetBufferAndMode(char *, size_t, BufferKind)");
}

Assistant:

void raw_ostream::SetBufferAndMode(char *BufferStart, size_t Size,
                                   BufferKind Mode) {
  assert(((Mode == BufferKind::Unbuffered && !BufferStart && Size == 0) ||
          (Mode != BufferKind::Unbuffered && BufferStart && Size != 0)) &&
         "stream must be unbuffered or have at least one byte");
  // Make sure the current buffer is free of content (we can't flush here; the
  // child buffer management logic will be in write_impl).
  assert(GetNumBytesInBuffer() == 0 && "Current buffer is non-empty!");

  if (BufferMode == BufferKind::InternalBuffer)
    delete [] OutBufStart;
  OutBufStart = BufferStart;
  OutBufEnd = OutBufStart+Size;
  OutBufCur = OutBufStart;
  BufferMode = Mode;

  assert(OutBufStart <= OutBufEnd && "Invalid size!");
}